

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O1

BZFILE * BZ2_bzReadOpen(int *bzerror,FILE *f,int verbosity,int small,void *unused,int nUnused)

{
  int iVar1;
  undefined8 *__ptr;
  
  if (bzerror != (int *)0x0) {
    *bzerror = 0;
  }
  if ((((f == (FILE *)0x0) || (4 < (uint)verbosity || 1 < (uint)small)) ||
      (unused == (void *)0x0 && nUnused != 0)) || (5000 < (uint)nUnused && unused != (void *)0x0)) {
    if (bzerror != (int *)0x0) {
      *bzerror = -2;
    }
  }
  else {
    iVar1 = ferror((FILE *)f);
    if (iVar1 == 0) {
      __ptr = (undefined8 *)malloc(0x13f0);
      if (__ptr == (undefined8 *)0x0) {
        if (bzerror != (int *)0x0) {
          *bzerror = -3;
        }
      }
      else {
        if (bzerror != (int *)0x0) {
          *bzerror = 0;
        }
        *(undefined4 *)(__ptr + 0x27d) = 0;
        *(undefined1 *)((long)__ptr + 0x13ec) = 0;
        *__ptr = f;
        *(undefined4 *)(__ptr + 0x272) = 0;
        *(undefined1 *)((long)__ptr + 0x1394) = 0;
        __ptr[0x27a] = 0;
        __ptr[0x27b] = 0;
        __ptr[0x27c] = 0;
        if (0 < nUnused) {
          iVar1 = nUnused + 1;
          do {
            *(undefined1 *)((long)__ptr + (long)*(int *)(__ptr + 0x272) + 8) = *unused;
            *(int *)(__ptr + 0x272) = *(int *)(__ptr + 0x272) + 1;
            unused = (void *)((long)unused + 1);
            iVar1 = iVar1 + -1;
          } while (1 < iVar1);
        }
        iVar1 = BZ2_bzDecompressInit((bz_stream *)(__ptr + 0x273),verbosity,small);
        if (iVar1 == 0) {
          *(undefined4 *)(__ptr + 0x274) = *(undefined4 *)(__ptr + 0x272);
          __ptr[0x273] = __ptr + 1;
          *(undefined1 *)((long)__ptr + 0x13ec) = 1;
          return __ptr;
        }
        if (bzerror != (int *)0x0) {
          *bzerror = iVar1;
        }
        *(int *)(__ptr + 0x27d) = iVar1;
        free(__ptr);
      }
    }
    else if (bzerror != (int *)0x0) {
      *bzerror = -6;
    }
  }
  return (BZFILE *)0x0;
}

Assistant:

BZFILE* BZ_API(BZ2_bzReadOpen) 
                   ( int*  bzerror, 
                     FILE* f, 
                     int   verbosity,
                     int   small,
                     void* unused,
                     int   nUnused )
{
   bzFile* bzf = NULL;
   int     ret;

   BZ_SETERR(BZ_OK);

   if (f == NULL || 
       (small != 0 && small != 1) ||
       (verbosity < 0 || verbosity > 4) ||
       (unused == NULL && nUnused != 0) ||
       (unused != NULL && (nUnused < 0 || nUnused > BZ_MAX_UNUSED)))
      { BZ_SETERR(BZ_PARAM_ERROR); return NULL; };

   if (ferror(f))
      { BZ_SETERR(BZ_IO_ERROR); return NULL; };

   bzf = (bzFile *)malloc ( sizeof(bzFile) );
   if (bzf == NULL) 
      { BZ_SETERR(BZ_MEM_ERROR); return NULL; };

   BZ_SETERR(BZ_OK);

   bzf->initialisedOk = False;
   bzf->handle        = f;
   bzf->bufN          = 0;
   bzf->writing       = False;
   bzf->strm.bzalloc  = NULL;
   bzf->strm.bzfree   = NULL;
   bzf->strm.opaque   = NULL;
   
   while (nUnused > 0) {
      bzf->buf[bzf->bufN] = *((UChar*)(unused)); bzf->bufN++;
      unused = ((void*)( 1 + ((UChar*)(unused))  ));
      nUnused--;
   }

   ret = BZ2_bzDecompressInit ( &(bzf->strm), verbosity, small );
   if (ret != BZ_OK)
      { BZ_SETERR(ret); free(bzf); return NULL; };

   bzf->strm.avail_in = bzf->bufN;
   bzf->strm.next_in  = bzf->buf;

   bzf->initialisedOk = True;
   return bzf;   
}